

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *this)

{
  QRegularExpressionMatchIteratorPrivate *pQVar1;
  QRegularExpressionMatchPrivate *pQVar2;
  QRegularExpressionPrivate *pQVar3;
  MatchOptions MVar4;
  QRegularExpressionMatchIteratorPrivate *pQVar5;
  
  pQVar5 = (QRegularExpressionMatchIteratorPrivate *)operator_new(0x20);
  pQVar1 = (this->d).ptr;
  (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pQVar2 = (pQVar1->next).d.d.ptr;
  (pQVar5->next).d.d.ptr = pQVar2;
  if (pQVar2 != (QRegularExpressionMatchPrivate *)0x0) {
    LOCK();
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int> =
         (QBasicAtomicInteger<int>)
         ((int)(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int> + 1);
    UNLOCK();
  }
  pQVar3 = (pQVar1->regularExpression).d.d.ptr;
  (pQVar5->regularExpression).d.d.ptr = pQVar3;
  if (pQVar3 != (QRegularExpressionPrivate *)0x0) {
    LOCK();
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int> =
         (QBasicAtomicInteger<int>)
         ((int)(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int> + 1);
    UNLOCK();
  }
  MVar4.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
  super_QFlagsStorage<QRegularExpression::MatchOption>.i =
       (pQVar1->matchOptions).super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>;
  pQVar5->matchType = pQVar1->matchType;
  pQVar5->matchOptions =
       (MatchOptions)
       MVar4.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
       super_QFlagsStorage<QRegularExpression::MatchOption>.i;
  LOCK();
  (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if (((__int_type)
       (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int> == 0) &&
     (pQVar1 = (this->d).ptr, pQVar1 != (QRegularExpressionMatchIteratorPrivate *)0x0)) {
    QExplicitlySharedDataPointer<QRegularExpressionPrivate>::~QExplicitlySharedDataPointer
              (&(pQVar1->regularExpression).d);
    QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::~QExplicitlySharedDataPointer
              (&(pQVar1->next).d);
    operator_delete(pQVar1,0x20);
  }
  (this->d).ptr = pQVar5;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}